

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O0

QRgbaFloat32 *
fetchRGB30ToRGBA32F<(QtPixelOrder)0>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  QRgbaFloat32 *pQVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  QList<unsigned_int> *in_RSI;
  undefined8 in_RDI;
  
  pQVar1 = convertA2RGB30PMToRGBA32F<(QtPixelOrder)0>
                     ((QRgbaFloat32 *)param_5,(uint *)param_6,(int)((ulong)in_RDI >> 0x20),in_RSI,
                      (QDitherInfo *)CONCAT44(in_EDX,in_ECX));
  return pQVar1;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGB30ToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                       const QList<QRgb> *, QDitherInfo *)
{
    return convertA2RGB30PMToRGBA32F<PixelOrder>(buffer, reinterpret_cast<const uint *>(src) + index, count, nullptr, nullptr);
}